

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.h
# Opt level: O3

void __thiscall CVmRun::push_string(CVmRun *this,char *str)

{
  vm_val_t *pvVar1;
  vm_obj_id_t vVar2;
  vm_datatype_t vVar3;
  size_t bytelen;
  
  bytelen = strlen(str);
  pvVar1 = sp_;
  sp_ = sp_ + 1;
  if (str == (char *)0x0) {
    vVar3 = VM_NIL;
  }
  else {
    vVar2 = CVmObjString::create(0,str,bytelen);
    (pvVar1->val).obj = vVar2;
    vVar3 = VM_OBJ;
  }
  pvVar1->typ = vVar3;
  return;
}

Assistant:

void push_string(VMG_ const char *str)
        { push_string(vmg_ str, strlen(str)); }